

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

void Fixpp::
     set<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>,Fixpp::Type::UTCTimeOnly::Time&>
               (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                *message,Time *value)

{
  type_by_index_t<5UL,_Fixpp::Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::Field<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::Field<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *this;
  bool *pbVar1;
  Time *value_local;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *message_local;
  
  this = meta::
         get<5ul,Fixpp::Field<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::Field<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::Field<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::Field<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::Field<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::Field<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::Field<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<625u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::Field<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::Field<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::Field<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<546u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<811u,Fixpp::Type::Float>>,Fixpp::Field<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                   ((tuple<Fixpp::Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::Field<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::Field<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                     *)message);
  Field<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>::set<Fixpp::Type::UTCTimeOnly::Time&>
            ((Field<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>> *)this,value);
  std::bitset<32UL>::set
            (&(message->
              super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
              ).allBits,5,true);
  pbVar1 = identity<bool>(&details::
                           TagIndex<meta::typelist::TypeList<Fixpp::TagT<269U,_Fixpp::Type::Char>,_meta::typelist::NullType>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>
                           ::Valid);
  if ((*pbVar1 & 1U) != 0) {
    std::bitset<1UL>::set
              (&(message->
                super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                ).requiredBits,0xffffffffffffffff,true);
  }
  return;
}

Assistant:

decltype(auto)
    set(Message& message, Value&& value)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        using RequiredIndex = details::TagIndex<typename Message::RequiredList, Tag>;

        static_assert(Index::Valid, "Invalid tag for given message");
        static_assert(details::IsValidTypeFor<Tag, Value>::value, "Invalid data type for given Tag");

        meta::get<Index::Value>(message.values).set(std::forward<Value>(value));

        message.allBits.set(Index::Value);

        if (identity(RequiredIndex::Valid))
            message.requiredBits.set(static_cast<size_t>(RequiredIndex::Value));
    }